

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void mi_arena_purge(mi_arena_t *arena,size_t bitmap_idx,size_t blocks)

{
  uint8_t *puVar1;
  _Bool _Var2;
  size_t already_committed;
  size_t local_38;
  
  puVar1 = arena->start;
  local_38 = 0;
  _Var2 = _mi_bitmap_is_claimed_across
                    (arena->blocks_committed,arena->field_count,blocks,bitmap_idx,&local_38);
  if (_Var2) {
    _Var2 = _mi_os_purge(puVar1 + bitmap_idx * 0x2000000,blocks << 0x19);
  }
  else {
    _Var2 = _mi_os_purge_ex(puVar1 + bitmap_idx * 0x2000000,blocks << 0x19,false,local_38 << 0x19);
  }
  _mi_bitmap_unclaim_across(arena->blocks_purge,arena->field_count,blocks,bitmap_idx);
  if (_Var2 != false) {
    _mi_bitmap_unclaim_across(arena->blocks_committed,arena->field_count,blocks,bitmap_idx);
  }
  return;
}

Assistant:

static void mi_arena_purge(mi_arena_t* arena, size_t bitmap_idx, size_t blocks) {
  mi_assert_internal(arena->blocks_committed != NULL);
  mi_assert_internal(arena->blocks_purge != NULL);
  mi_assert_internal(!arena->memid.is_pinned);
  const size_t size = mi_arena_block_size(blocks);
  void* const p = mi_arena_block_start(arena, bitmap_idx);
  bool needs_recommit;
  size_t already_committed = 0;
  if (_mi_bitmap_is_claimed_across(arena->blocks_committed, arena->field_count, blocks, bitmap_idx, &already_committed)) {
    // all blocks are committed, we can purge freely
    mi_assert_internal(already_committed == blocks);
    needs_recommit = _mi_os_purge(p, size);
  }
  else {
    // some blocks are not committed -- this can happen when a partially committed block is freed
    // in `_mi_arena_free` and it is conservatively marked as uncommitted but still scheduled for a purge
    // we need to ensure we do not try to reset (as that may be invalid for uncommitted memory).
    mi_assert_internal(already_committed < blocks);
    mi_assert_internal(mi_option_is_enabled(mi_option_purge_decommits));
    needs_recommit = _mi_os_purge_ex(p, size, false /* allow reset? */, mi_arena_block_size(already_committed));    
  }

  // clear the purged blocks
  _mi_bitmap_unclaim_across(arena->blocks_purge, arena->field_count, blocks, bitmap_idx);
  // update committed bitmap
  if (needs_recommit) {
    _mi_bitmap_unclaim_across(arena->blocks_committed, arena->field_count, blocks, bitmap_idx);
  }
}